

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

bool __thiscall IPStats::LoadCdnsRecords(IPStats *this,cdns *cdns_ctx,int *err)

{
  bool bVar1;
  size_type sVar2;
  ulong local_30;
  size_t i;
  bool ret;
  int *err_local;
  cdns *cdns_ctx_local;
  IPStats *this_local;
  
  while (bVar1 = cdns::open_block(cdns_ctx,err), bVar1) {
    for (local_30 = 0;
        sVar2 = std::vector<cdns_query,_std::allocator<cdns_query>_>::size
                          (&(cdns_ctx->block).queries), local_30 < sVar2; local_30 = local_30 + 1) {
      SubmitCborPacket(this,cdns_ctx,local_30);
    }
  }
  return *err == -1;
}

Assistant:

bool IPStats::LoadCdnsRecords(cdns * cdns_ctx, int * err)
{
    bool ret = true;

    while (ret) {
        if (!cdns_ctx->open_block(err)) {
            ret = (*err == CBOR_END_OF_ARRAY);
            break;
        }
        for (size_t i = 0; i < cdns_ctx->block.queries.size(); i++) {
            SubmitCborPacket(cdns_ctx, i);
        }
    }
    return ret;
}